

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::BaseTag::CreateScenarioLowerBound(BaseTag *this,string *name,string *particle_bound_name)

{
  OBS_TYPE OVar1;
  MMAPInferencer *pMVar2;
  MMAPInferencer *pMVar3;
  StatePolicy *pSVar4;
  StateIndexer *pSVar5;
  bool bVar6;
  int iVar7;
  BaseTag *pBVar8;
  ParticleLowerBound *pPVar9;
  ostream *poVar10;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280;
  undefined1 local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230;
  undefined1 local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190;
  undefined1 local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140;
  undefined1 local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_c9;
  string local_c8 [39];
  undefined1 local_a1;
  string local_a0 [39];
  undefined1 local_79;
  string local_78 [48];
  MMAPInferencer *local_48;
  MMAPInferencer *mmap_inferencer;
  StatePolicy *policy;
  StateIndexer *indexer;
  DSPOMDP *model;
  string *particle_bound_name_local;
  string *name_local;
  BaseTag *this_local;
  
  indexer = (StateIndexer *)&this->super_BeliefMDP;
  policy = (StatePolicy *)&this->super_StateIndexer;
  mmap_inferencer = (MMAPInferencer *)&this->super_StatePolicy;
  local_48 = &this->super_MMAPInferencer;
  model = (DSPOMDP *)particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar6 = std::operator==(name,"TRIVIAL");
  if (bVar6) {
    pBVar8 = (BaseTag *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)pBVar8,(DSPOMDP *)indexer);
    this_local = pBVar8;
  }
  else {
    bVar6 = std::operator==(name,"RANDOM");
    if (bVar6) {
      pBVar8 = (BaseTag *)operator_new(0x38);
      pSVar5 = indexer;
      local_79 = 1;
      std::__cxx11::string::string(local_78,(string *)particle_bound_name);
      pPVar9 = (ParticleLowerBound *)
               (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                         (&this->super_BeliefMDP,local_78);
      despot::RandomPolicy::RandomPolicy((RandomPolicy *)pBVar8,(DSPOMDP *)pSVar5,pPVar9);
      local_79 = 0;
      this_local = pBVar8;
      std::__cxx11::string::~string(local_78);
    }
    else {
      bVar6 = std::operator==(name,"SHR");
      if ((bVar6) ||
         ((bVar6 = std::operator==(name,"DEFAULT"), bVar6 &&
          (OVar1 = this->same_loc_obs_, iVar7 = despot::Floor::NumCells(), OVar1 != (long)iVar7))))
      {
        pBVar8 = (BaseTag *)operator_new(0x68);
        pSVar5 = indexer;
        local_a1 = 1;
        std::__cxx11::string::string(local_a0,(string *)particle_bound_name);
        pPVar9 = (ParticleLowerBound *)
                 (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                           (&this->super_BeliefMDP,local_a0);
        TagSHRPolicy::TagSHRPolicy((TagSHRPolicy *)pBVar8,(DSPOMDP *)pSVar5,pPVar9);
        local_a1 = 0;
        this_local = pBVar8;
        std::__cxx11::string::~string(local_a0);
      }
      else {
        bVar6 = std::operator==(name,"HM");
        if (bVar6) {
          pBVar8 = (BaseTag *)operator_new(0xa8);
          pSVar5 = indexer;
          local_c9 = 1;
          std::__cxx11::string::string(local_c8,(string *)particle_bound_name);
          pPVar9 = (ParticleLowerBound *)
                   (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                             (&this->super_BeliefMDP,local_c8);
          TagHistoryModePolicy::TagHistoryModePolicy
                    ((TagHistoryModePolicy *)pBVar8,(DSPOMDP *)pSVar5,pPVar9);
          local_c9 = 0;
          this_local = pBVar8;
          std::__cxx11::string::~string(local_c8);
        }
        else {
          bVar6 = std::operator==(name,"MMAP-MDP");
          if (bVar6) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"MDP",&local_f1);
            ComputeDefaultActions(this,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::allocator<char>::~allocator(&local_f1);
            pBVar8 = (BaseTag *)operator_new(0x30);
            pSVar5 = indexer;
            pMVar3 = mmap_inferencer;
            pMVar2 = local_48;
            local_119 = 1;
            std::__cxx11::string::string(local_118,(string *)particle_bound_name);
            pPVar9 = (ParticleLowerBound *)
                     (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                               (&this->super_BeliefMDP,local_118);
            despot::MMAPStatePolicy::MMAPStatePolicy
                      ((MMAPStatePolicy *)pBVar8,(DSPOMDP *)pSVar5,pMVar2,(StatePolicy *)pMVar3,
                       pPVar9);
            local_119 = 0;
            this_local = pBVar8;
            std::__cxx11::string::~string(local_118);
          }
          else {
            bVar6 = std::operator==(name,"MMAP-SP");
            if (bVar6) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,"SP",&local_141);
              ComputeDefaultActions(this,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
              std::allocator<char>::~allocator(&local_141);
              pBVar8 = (BaseTag *)operator_new(0x30);
              pSVar5 = indexer;
              pMVar3 = mmap_inferencer;
              pMVar2 = local_48;
              local_169 = 1;
              std::__cxx11::string::string(local_168,(string *)particle_bound_name);
              pPVar9 = (ParticleLowerBound *)
                       (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                                 (&this->super_BeliefMDP,local_168);
              despot::MMAPStatePolicy::MMAPStatePolicy
                        ((MMAPStatePolicy *)pBVar8,(DSPOMDP *)pSVar5,pMVar2,(StatePolicy *)pMVar3,
                         pPVar9);
              local_169 = 0;
              this_local = pBVar8;
              std::__cxx11::string::~string(local_168);
            }
            else {
              bVar6 = std::operator==(name,"MODE-MDP");
              if ((bVar6) ||
                 ((bVar6 = std::operator==(name,"DEFAULT"), bVar6 &&
                  (OVar1 = this->same_loc_obs_, iVar7 = despot::Floor::NumCells(),
                  OVar1 == (long)iVar7)))) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_190,"MDP",&local_191);
                ComputeDefaultActions(this,&local_190);
                std::__cxx11::string::~string((string *)&local_190);
                std::allocator<char>::~allocator(&local_191);
                pBVar8 = (BaseTag *)operator_new(0x48);
                pSVar5 = indexer;
                pSVar4 = policy;
                pMVar2 = mmap_inferencer;
                local_1b9 = 1;
                std::__cxx11::string::string(local_1b8,(string *)particle_bound_name);
                pPVar9 = (ParticleLowerBound *)
                         (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                                   (&this->super_BeliefMDP,local_1b8);
                despot::ModeStatePolicy::ModeStatePolicy
                          ((ModeStatePolicy *)pBVar8,(DSPOMDP *)pSVar5,(StateIndexer *)pSVar4,
                           (StatePolicy *)pMVar2,pPVar9);
                local_1b9 = 0;
                this_local = pBVar8;
                std::__cxx11::string::~string(local_1b8);
              }
              else {
                bVar6 = std::operator==(name,"MODE-SP");
                if (bVar6) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1e0,"SP",&local_1e1);
                  ComputeDefaultActions(this,&local_1e0);
                  std::__cxx11::string::~string((string *)&local_1e0);
                  std::allocator<char>::~allocator(&local_1e1);
                  pBVar8 = (BaseTag *)operator_new(0x48);
                  pSVar5 = indexer;
                  pSVar4 = policy;
                  pMVar2 = mmap_inferencer;
                  local_209 = 1;
                  std::__cxx11::string::string(local_208,(string *)particle_bound_name);
                  pPVar9 = (ParticleLowerBound *)
                           (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                                     (&this->super_BeliefMDP,local_208);
                  despot::ModeStatePolicy::ModeStatePolicy
                            ((ModeStatePolicy *)pBVar8,(DSPOMDP *)pSVar5,(StateIndexer *)pSVar4,
                             (StatePolicy *)pMVar2,pPVar9);
                  local_209 = 0;
                  this_local = pBVar8;
                  std::__cxx11::string::~string(local_208);
                }
                else {
                  bVar6 = std::operator==(name,"MAJORITY-MDP");
                  if (bVar6) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_230,"MDP",&local_231);
                    ComputeDefaultActions(this,&local_230);
                    std::__cxx11::string::~string((string *)&local_230);
                    std::allocator<char>::~allocator(&local_231);
                    pBVar8 = (BaseTag *)operator_new(0x28);
                    pSVar5 = indexer;
                    pMVar2 = mmap_inferencer;
                    local_259 = 1;
                    std::__cxx11::string::string(local_258,(string *)particle_bound_name);
                    pPVar9 = (ParticleLowerBound *)
                             (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                                       (&this->super_BeliefMDP,local_258);
                    despot::MajorityActionPolicy::MajorityActionPolicy
                              ((MajorityActionPolicy *)pBVar8,(DSPOMDP *)pSVar5,
                               (StatePolicy *)pMVar2,pPVar9);
                    local_259 = 0;
                    this_local = pBVar8;
                    std::__cxx11::string::~string(local_258);
                  }
                  else {
                    bVar6 = std::operator==(name,"MAJORITY-SP");
                    if (!bVar6) {
                      bVar6 = std::operator!=(name,"print");
                      if (bVar6) {
                        poVar10 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound: ")
                        ;
                        poVar10 = std::operator<<(poVar10,(string *)name);
                        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      }
                      poVar10 = std::operator<<((ostream *)&std::cerr,
                                                "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)"
                                               );
                      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      poVar10 = std::operator<<((ostream *)&std::cerr,
                                                "With base lower bound: except TRIVIAL");
                      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      exit(1);
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_280,"SP",&local_281);
                    ComputeDefaultActions(this,&local_280);
                    std::__cxx11::string::~string((string *)&local_280);
                    std::allocator<char>::~allocator(&local_281);
                    pBVar8 = (BaseTag *)operator_new(0x28);
                    pSVar5 = indexer;
                    pMVar2 = mmap_inferencer;
                    std::__cxx11::string::string(local_2a8,(string *)particle_bound_name);
                    pPVar9 = (ParticleLowerBound *)
                             (**(code **)(*(long *)&this->super_BeliefMDP + 0x70))
                                       (&this->super_BeliefMDP,local_2a8);
                    despot::MajorityActionPolicy::MajorityActionPolicy
                              ((MajorityActionPolicy *)pBVar8,(DSPOMDP *)pSVar5,
                               (StatePolicy *)pMVar2,pPVar9);
                    this_local = pBVar8;
                    std::__cxx11::string::~string(local_2a8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* BaseTag::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	const MMAPInferencer* mmap_inferencer = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SHR"
		|| (name == "DEFAULT" && same_loc_obs_ != floor_.NumCells())) {
		return new TagSHRPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "HM") {
		return new TagHistoryModePolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-MDP") {
		ComputeDefaultActions("MDP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-SP") {
		ComputeDefaultActions("SP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-MDP"
		|| (name == "DEFAULT" && same_loc_obs_ == floor_.NumCells())) {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-SP") {
		ComputeDefaultActions("SP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-MDP") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-SP") {
		ComputeDefaultActions("SP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)" << endl;
		cerr << "With base lower bound: except TRIVIAL" << endl;
		exit(1);
		return NULL;
	}
}